

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rct.cpp
# Opt level: O0

char * Rct::demangle(char *str)

{
  char *pcVar1;
  char *ret;
  size_t len;
  char buf [1024];
  char *plus;
  size_t l;
  char *paren;
  char *pcStack_18;
  int status;
  char *str_local;
  
  if (str == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    pcStack_18 = str;
    pcVar1 = strchr(str,0x28);
    if (pcVar1 == (char *)0x0) {
      l = (size_t)pcStack_18;
    }
    else {
      l = (size_t)(pcVar1 + 1);
    }
    buf._1016_8_ = strchr((char *)l,0x2b);
    if ((char *)buf._1016_8_ == (char *)0x0) {
      plus = (char *)strlen((char *)l);
    }
    else {
      plus = (char *)(buf._1016_8_ + -l);
    }
    if (plus < (char *)0x400) {
      memcpy(&len,(void *)l,(size_t)(plus + 1));
      *(char *)((long)&len + (long)plus) = '\0';
      str_local = (char *)__cxa_demangle(&len,0,0,(long)&paren + 4);
      if (paren._4_4_ != 0) {
        if (str_local != (char *)0x0) {
          free(str_local);
        }
        str_local = (char *)0x0;
      }
    }
    else {
      str_local = (char *)0x0;
    }
  }
  return str_local;
}

Assistant:

static inline char *demangle(const char *str)
{
    if (!str)
        return 0;
    int status;
#ifdef OS_Darwin
    char paren[1024];
    sscanf(str, "%*d %*s %*s %s %*s %*d", paren);
#else
    const char *paren = strchr(str, '(');
    if (!paren) {
        paren = str;
    } else {
        ++paren;
    }
#endif
    size_t l;
    if (const char *plus = strchr(paren, '+')) {
        l = plus - paren;
    } else {
        l = strlen(paren);
    }

    char buf[1024];
    size_t len = sizeof(buf);
    if (l >= len)
        return 0;
    memcpy(buf, paren, l + 1);
    buf[l] = '\0';
    char *ret = abi::__cxa_demangle(buf, 0, 0, &status);
    if (status != 0) {
        if (ret)
            free(ret);
#ifdef OS_Darwin
        return strdup(paren);
#else
        return 0;
#endif
    }
    return ret;
}